

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::RegisteredLoggers::RegisteredLoggers
          (RegisteredLoggers *this,LogBuilderPtr *defaultLogBuilder)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_buckets =
       &(this->
        super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
        .m_list._M_h._M_single_bucket;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_bucket_count = 1;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_element_count = 0;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_rehash_policy._M_next_resize = 0;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .m_list._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->
  super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00193700;
  (this->m_defaultLogBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (defaultLogBuilder->super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (defaultLogBuilder->super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_defaultLogBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  *(undefined8 *)
   &(this->m_defaultConfigurations).
    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .m_list = 0;
  *(undefined8 *)
   &(this->m_defaultConfigurations).
    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .field_0x18 = 0;
  *(undefined8 *)
   &(this->m_defaultConfigurations).
    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .field_0x20 = 0;
  (this->m_defaultConfigurations).
  super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00192ab0;
  (this->m_defaultConfigurations).m_configurationFile._M_dataplus._M_p =
       (pointer)&(this->m_defaultConfigurations).m_configurationFile.field_2;
  (this->m_defaultConfigurations).m_configurationFile._M_string_length = 0;
  (this->m_defaultConfigurations).m_configurationFile.field_2._M_local_buf[0] = '\0';
  (this->m_defaultConfigurations).m_isFromFile = false;
  (this->m_logStreamsReference)._M_h._M_buckets =
       &(this->m_logStreamsReference)._M_h._M_single_bucket;
  (this->m_logStreamsReference)._M_h._M_bucket_count = 1;
  (this->m_logStreamsReference)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_logStreamsReference)._M_h._M_element_count = 0;
  (this->m_logStreamsReference)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_logStreamsReference)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_logStreamsReference)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_loggerRegistrationCallbacks)._M_h._M_buckets =
       &(this->m_loggerRegistrationCallbacks)._M_h._M_single_bucket;
  (this->m_loggerRegistrationCallbacks)._M_h._M_bucket_count = 1;
  (this->m_loggerRegistrationCallbacks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_loggerRegistrationCallbacks)._M_h._M_element_count = 0;
  (this->m_loggerRegistrationCallbacks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_loggerRegistrationCallbacks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_loggerRegistrationCallbacks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Configurations::setToDefault(&this->m_defaultConfigurations);
  return;
}

Assistant:

RegisteredLoggers::RegisteredLoggers(const LogBuilderPtr& defaultLogBuilder) :
  m_defaultLogBuilder(defaultLogBuilder) {
  m_defaultConfigurations.setToDefault();
}